

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O2

void __thiscall
InstructionSet::x86::Flags::
set_from<unsigned_int,(InstructionSet::x86::Flag)5,(InstructionSet::x86::Flag)4>
          (Flags *this,uint value)

{
  long lVar1;
  undefined8 local_8;
  
  local_8 = 0x400000005;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    switch(*(undefined4 *)((long)&local_8 + lVar1)) {
    case 0:
      this->carry_ = value;
      break;
    case 1:
      this->auxiliary_carry_ = value;
      break;
    case 2:
      this->sign_ = value & 0x80000000;
      break;
    case 3:
      this->overflow_ = value;
      break;
    case 4:
      this->trap_ = value;
      break;
    case 5:
      this->interrupt_ = value;
      break;
    case 6:
      this->direction_ = -(uint)(value != 0) | 1;
      break;
    case 7:
      this->zero_ = value;
      break;
    case 8:
      this->parity_ = value;
    }
  }
  return;
}

Assistant:

void set_from(IntT value) {
			for(const auto flag: {flags...}) {
				switch(flag) {
					default: break;
					case Flag::Zero:			zero_ = value;								break;
					case Flag::Sign:			sign_ = value & Numeric::top_bit<IntT>();	break;
					case Flag::ParityOdd:		parity_ = value;							break;
					case Flag::Carry:			carry_ = value;								break;
					case Flag::AuxiliaryCarry:	auxiliary_carry_ = value;					break;
					case Flag::Overflow:		overflow_ = value;							break;
					case Flag::Interrupt:		interrupt_ = value;							break;
					case Flag::Trap:			trap_ = value;								break;
					case Flag::Direction:		direction_ = value ? -1 : 1;				break;
				}
			}
		}